

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTable.h
# Opt level: O3

void __thiscall
glslang::TSymbolTable::setPreviousDefaultPrecisions(TSymbolTable *this,TPrecisionQualifier *p)

{
  pointer ppTVar1;
  TSymbolTableLevel *pTVar2;
  TPrecisionQualifier *pTVar3;
  long lVar4;
  byte bVar5;
  
  bVar5 = 0;
  ppTVar1 = (this->table).
            super__Vector_base<glslang::TSymbolTableLevel_*,_std::allocator<glslang::TSymbolTableLevel_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pTVar2 = ppTVar1[((long)(this->table).
                          super__Vector_base<glslang::TSymbolTableLevel_*,_std::allocator<glslang::TSymbolTableLevel_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar1) * 0x20000000 +
                   -0x100000000 >> 0x20];
  if (pTVar2->defaultPrecision == (TPrecisionQualifier *)0x0) {
    pTVar3 = (TPrecisionQualifier *)operator_new__(0x70);
    pTVar2->defaultPrecision = pTVar3;
    for (lVar4 = 0x1c; lVar4 != 0; lVar4 = lVar4 + -1) {
      *pTVar3 = *p;
      p = p + (ulong)bVar5 * -2 + 1;
      pTVar3 = pTVar3 + (ulong)bVar5 * -2 + 1;
    }
  }
  return;
}

Assistant:

void setPreviousDefaultPrecisions(TPrecisionQualifier *p) { table[currentLevel()]->setPreviousDefaultPrecisions(p); }